

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlOutputJson.c
# Opt level: O0

JL_STATUS ProcessTheStack(ProcessStack *Stack,JlBuffer *JsonBuffer,JL_OUTPUT_FLAGS OutputFlags)

{
  JlBuffer *pJVar1;
  ProcessStack *currentItem;
  uint32_t stackDepth;
  JL_STATUS jlStatus;
  JL_OUTPUT_FLAGS OutputFlags_local;
  JlBuffer *JsonBuffer_local;
  ProcessStack *Stack_local;
  
  currentItem._0_4_ = 1;
  currentItem._4_4_ = JL_STATUS_SUCCESS;
  _stackDepth = OutputFlags;
  OutputFlags_local = (JL_OUTPUT_FLAGS)JsonBuffer;
  JsonBuffer_local = (JlBuffer *)Stack;
  while ((uint)currentItem != 0 && currentItem._4_4_ == JL_STATUS_SUCCESS) {
    pJVar1 = JsonBuffer_local + (uint)currentItem;
    if ((int)pJVar1->BufferAllocated == 1) {
      currentItem._4_4_ =
           OutputStringObject((JlDataObject *)pJVar1->BufferUsed,(JlBuffer *)OutputFlags_local,
                              _stackDepth,(uint)currentItem);
      currentItem._0_4_ = (uint)currentItem - 1;
    }
    else if ((int)pJVar1->BufferAllocated == 2) {
      currentItem._4_4_ =
           OutputNumberObject((JlDataObject *)pJVar1->BufferUsed,(JlBuffer *)OutputFlags_local,
                              _stackDepth,(uint)currentItem);
      currentItem._0_4_ = (uint)currentItem - 1;
    }
    else if ((int)pJVar1->BufferAllocated == 3) {
      currentItem._4_4_ =
           OutputBoolObject((JlDataObject *)pJVar1->BufferUsed,(JlBuffer *)OutputFlags_local,
                            _stackDepth,(uint)currentItem);
      currentItem._0_4_ = (uint)currentItem - 1;
    }
    else if ((int)pJVar1->BufferAllocated == 4) {
      currentItem._4_4_ =
           ProcessListOnStack((ProcessStack *)JsonBuffer_local,(uint32_t *)&currentItem,
                              (JlBuffer *)OutputFlags_local,_stackDepth);
    }
    else if ((int)pJVar1->BufferAllocated == 5) {
      currentItem._4_4_ =
           ProcessDictionaryOnStack
                     ((ProcessStack *)JsonBuffer_local,(uint32_t *)&currentItem,
                      (JlBuffer *)OutputFlags_local,_stackDepth);
    }
  }
  return currentItem._4_4_;
}

Assistant:

JL_STATUS
    ProcessTheStack
    (
        ProcessStack*   Stack,
        JlBuffer*       JsonBuffer,
        JL_OUTPUT_FLAGS OutputFlags
    )
{
    JL_STATUS jlStatus;
    uint32_t stackDepth = 1;

    jlStatus = JL_STATUS_SUCCESS;

    while( stackDepth > 0  &&  JL_STATUS_SUCCESS == jlStatus )
    {
        // Process current deepest stack item
        ProcessStack* currentItem = &Stack[stackDepth];

        if( JL_DATA_TYPE_STRING == currentItem->ObjectType )
        {
            // String object. Output the string
            jlStatus = OutputStringObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_NUMBER == currentItem->ObjectType )
        {
            // Number object. Output the number
            jlStatus = OutputNumberObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_BOOL == currentItem->ObjectType )
        {
            // Boolean object. Output the boolean
            jlStatus = OutputBoolObject( currentItem->Object, JsonBuffer, OutputFlags, stackDepth );
            stackDepth -= 1;
        }
        else if( JL_DATA_TYPE_LIST == currentItem->ObjectType )
        {
            jlStatus = ProcessListOnStack( Stack, &stackDepth, JsonBuffer, OutputFlags );
        }
        else if( JL_DATA_TYPE_DICTIONARY == currentItem->ObjectType )
        {
            jlStatus = ProcessDictionaryOnStack( Stack, &stackDepth, JsonBuffer, OutputFlags );
        }

    }

    return jlStatus;
}